

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varint_casts.cpp
# Opt level: O3

string_t __thiscall duckdb::IntToVarInt<short>(duckdb *this,Vector *result,short int_value)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  ulong uVar9;
  byte bVar10;
  uint uVar11;
  undefined6 in_register_00000012;
  idx_t len;
  idx_t extraout_RDX;
  short sVar12;
  ulong uVar13;
  Vector *vector;
  undefined1 *puVar14;
  char *blob_00;
  double dVar15;
  ulong uVar16;
  long lVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  int iVar40;
  undefined1 auVar38 [16];
  int iVar41;
  undefined1 auVar39 [16];
  int iVar42;
  int iVar53;
  int iVar54;
  int iVar55;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 in_XMM10 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  int iVar66;
  undefined1 auVar65 [16];
  int iVar67;
  long lVar68;
  long lVar76;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  long lVar77;
  long lVar78;
  string_t sVar79;
  string_t blob;
  undefined1 local_68 [16];
  long local_58;
  long lStack_50;
  undefined1 local_48 [16];
  
  len = CONCAT62(in_register_00000012,int_value);
  sVar12 = (short)result;
  local_58 = CONCAT44(local_58._4_4_,(int)result);
  if (sVar12 < 0) {
    uVar9 = -(long)sVar12;
  }
  else {
    uVar9 = (ulong)result & 0xffff;
    if (sVar12 == 0) {
      uVar11 = 1;
      uVar9 = 0;
      goto LAB_013baef2;
    }
  }
  dVar15 = log2((double)((int)uVar9 + 1));
  dVar15 = ceil(dVar15 * 0.125);
  uVar11 = (uint)(long)dVar15;
  len = extraout_RDX;
LAB_013baef2:
  vector = (Vector *)(ulong)(uVar11 + 3);
  local_68 = (undefined1  [16])StringVector::EmptyString((StringVector *)this,vector,len);
  blob_00 = local_68._8_8_;
  if (local_68._0_4_ < 0xd) {
    blob_00 = local_68 + 4;
  }
  Varint::SetHeader(blob_00,(ulong)uVar11,SUB81(((ulong)result & 0xffff) >> 0xf,0));
  if (0 < (int)uVar11) {
    puVar14 = (undefined1 *)
              ((long)&vector[-1].auxiliary.internal.
                      super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi + 4);
    uVar16 = (ulong)uVar11;
    lVar68 = uVar16 - 0xe;
    uVar13 = (ulong)uVar11;
    lVar76 = uVar13 - 0xf;
    lVar26 = uVar16 - 0xc;
    lVar27 = uVar13 - 0xd;
    lVar28 = uVar16 - 10;
    lVar29 = uVar13 - 0xb;
    lVar30 = uVar16 - 8;
    lVar31 = uVar13 - 9;
    lVar32 = uVar16 - 6;
    lVar33 = uVar13 - 7;
    lVar34 = uVar16 - 4;
    lVar35 = uVar13 - 5;
    lVar77 = uVar16 - 2;
    lVar78 = uVar13 - 3;
    lVar17 = uVar13 - 1;
    local_48._8_4_ = (int)puVar14;
    local_48._0_8_ = puVar14;
    local_48._12_4_ = (int)((ulong)puVar14 >> 0x20);
    uVar11 = (uint)(short)local_58;
    uVar13 = 0;
    do {
      auVar65._8_4_ = (int)uVar13;
      auVar65._0_8_ = uVar13;
      auVar65._12_4_ = (int)(uVar13 >> 0x20);
      auVar38 = local_48 ^ _DAT_01d84390;
      auVar36 = (auVar65 | _DAT_01d84380) ^ _DAT_01d84390;
      iVar66 = auVar38._0_4_;
      iVar42 = -(uint)(iVar66 < auVar36._0_4_);
      iVar67 = auVar38._4_4_;
      iVar53 = -(uint)(iVar67 < auVar36._4_4_);
      iVar40 = auVar38._8_4_;
      iVar54 = -(uint)(iVar40 < auVar36._8_4_);
      iVar41 = auVar38._12_4_;
      iVar55 = -(uint)(iVar41 < auVar36._12_4_);
      auVar69._4_4_ = iVar42;
      auVar69._0_4_ = iVar42;
      auVar69._8_4_ = iVar54;
      auVar69._12_4_ = iVar54;
      auVar61 = pshuflw(in_XMM12,auVar69,0xe8);
      auVar43._4_4_ = -(uint)(auVar36._4_4_ == iVar67);
      auVar43._12_4_ = -(uint)(auVar36._12_4_ == iVar41);
      auVar43._0_4_ = auVar43._4_4_;
      auVar43._8_4_ = auVar43._12_4_;
      auVar56 = pshuflw(in_XMM10,auVar43,0xe8);
      auVar37._4_4_ = iVar53;
      auVar37._0_4_ = iVar53;
      auVar37._8_4_ = iVar55;
      auVar37._12_4_ = iVar55;
      auVar38 = pshuflw(_DAT_01d84390,auVar37,0xe8);
      auVar36._8_4_ = 0xffffffff;
      auVar36._0_8_ = 0xffffffffffffffff;
      auVar36._12_4_ = 0xffffffff;
      auVar36 = (auVar38 | auVar56 & auVar61) ^ auVar36;
      auVar36 = packssdw(auVar36,auVar36);
      bVar10 = (byte)(uVar11 >> 0xf);
      local_58 = lVar68;
      lStack_50 = lVar76;
      if ((auVar36 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        blob_00[uVar13 + 3] = (byte)(uVar9 >> (((char)uVar16 + -1) * '\b' & 0x3fU)) ^ bVar10;
      }
      auVar37 = auVar43 & auVar69 | auVar37;
      auVar36 = packssdw(auVar37,auVar37);
      auVar38._8_4_ = 0xffffffff;
      auVar38._0_8_ = 0xffffffffffffffff;
      auVar38._12_4_ = 0xffffffff;
      auVar36 = packssdw(auVar36 ^ auVar38,auVar36 ^ auVar38);
      auVar36 = packsswb(auVar36,auVar36);
      if ((auVar36._0_4_ >> 8 & 1) != 0) {
        blob_00[uVar13 + 4] = (byte)(uVar9 >> ((byte)((int)(lVar17 + -1) << 3) & 0x3f)) ^ bVar10;
      }
      auVar36 = (auVar65 | _DAT_01db3e50) ^ _DAT_01d84390;
      iVar42 = -(uint)(iVar66 < auVar36._0_4_);
      iVar54 = -(uint)(iVar67 < auVar36._4_4_);
      iVar53 = -(uint)(iVar40 < auVar36._8_4_);
      iVar55 = -(uint)(iVar41 < auVar36._12_4_);
      auVar61._4_4_ = iVar42;
      auVar61._0_4_ = iVar42;
      auVar61._8_4_ = iVar53;
      auVar61._12_4_ = iVar53;
      iVar42 = -(uint)(auVar36._4_4_ == iVar67);
      iVar53 = -(uint)(auVar36._12_4_ == iVar41);
      auVar70._4_4_ = iVar42;
      auVar70._0_4_ = iVar42;
      auVar70._8_4_ = iVar53;
      auVar70._12_4_ = iVar53;
      auVar62._4_4_ = iVar54;
      auVar62._0_4_ = iVar54;
      auVar62._8_4_ = iVar55;
      auVar62._12_4_ = iVar55;
      auVar36 = auVar70 & auVar61 | auVar62;
      auVar36 = packssdw(auVar36,auVar36);
      auVar56._8_4_ = 0xffffffff;
      auVar56._0_8_ = 0xffffffffffffffff;
      auVar56._12_4_ = 0xffffffff;
      auVar36 = packssdw(auVar36 ^ auVar56,auVar36 ^ auVar56);
      auVar36 = packsswb(auVar36,auVar36);
      if ((auVar36._0_4_ >> 0x10 & 1) != 0) {
        blob_00[uVar13 + 5] = (byte)(uVar9 >> (((char)lVar77 + -1) * '\b' & 0x3fU)) ^ bVar10;
      }
      auVar36 = pshufhw(auVar36,auVar61,0x84);
      auVar43 = pshufhw(auVar61,auVar70,0x84);
      auVar38 = pshufhw(auVar36,auVar62,0x84);
      auVar18._8_4_ = 0xffffffff;
      auVar18._0_8_ = 0xffffffffffffffff;
      auVar18._12_4_ = 0xffffffff;
      auVar18 = (auVar38 | auVar43 & auVar36) ^ auVar18;
      auVar36 = packssdw(auVar18,auVar18);
      auVar36 = packsswb(auVar36,auVar36);
      if ((auVar36._0_4_ >> 0x18 & 1) != 0) {
        blob_00[uVar13 + 6] = (byte)(uVar9 >> ((byte)((int)(lVar78 + -1) << 3) & 0x3f)) ^ bVar10;
      }
      auVar36 = (auVar65 | _DAT_01db3e80) ^ _DAT_01d84390;
      auVar57._0_4_ = -(uint)(iVar66 < auVar36._0_4_);
      auVar57._4_4_ = -(uint)(iVar67 < auVar36._4_4_);
      auVar57._8_4_ = -(uint)(iVar40 < auVar36._8_4_);
      auVar57._12_4_ = -(uint)(iVar41 < auVar36._12_4_);
      auVar71._4_4_ = auVar57._0_4_;
      auVar71._0_4_ = auVar57._0_4_;
      auVar71._8_4_ = auVar57._8_4_;
      auVar71._12_4_ = auVar57._8_4_;
      auVar43 = pshuflw(auVar62,auVar71,0xe8);
      auVar19._0_4_ = -(uint)(auVar36._0_4_ == iVar66);
      auVar19._4_4_ = -(uint)(auVar36._4_4_ == iVar67);
      auVar19._8_4_ = -(uint)(auVar36._8_4_ == iVar40);
      auVar19._12_4_ = -(uint)(auVar36._12_4_ == iVar41);
      auVar44._4_4_ = auVar19._4_4_;
      auVar44._0_4_ = auVar19._4_4_;
      auVar44._8_4_ = auVar19._12_4_;
      auVar44._12_4_ = auVar19._12_4_;
      auVar36 = pshuflw(auVar19,auVar44,0xe8);
      auVar45._4_4_ = auVar57._4_4_;
      auVar45._0_4_ = auVar57._4_4_;
      auVar45._8_4_ = auVar57._12_4_;
      auVar45._12_4_ = auVar57._12_4_;
      auVar38 = pshuflw(auVar57,auVar45,0xe8);
      auVar1._8_4_ = 0xffffffff;
      auVar1._0_8_ = 0xffffffffffffffff;
      auVar1._12_4_ = 0xffffffff;
      auVar36 = packssdw(auVar36 & auVar43,(auVar38 | auVar36 & auVar43) ^ auVar1);
      auVar36 = packsswb(auVar36,auVar36);
      if ((auVar36 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        blob_00[uVar13 + 7] = (byte)(uVar9 >> (((char)lVar34 + -1) * '\b' & 0x3fU)) ^ bVar10;
      }
      auVar45 = auVar44 & auVar71 | auVar45;
      auVar38 = packssdw(auVar45,auVar45);
      auVar2._8_4_ = 0xffffffff;
      auVar2._0_8_ = 0xffffffffffffffff;
      auVar2._12_4_ = 0xffffffff;
      auVar36 = packssdw(auVar36,auVar38 ^ auVar2);
      auVar36 = packsswb(auVar36,auVar36);
      if ((auVar36._4_2_ >> 8 & 1) != 0) {
        blob_00[uVar13 + 8] = (byte)(uVar9 >> ((byte)((int)(lVar35 + -1) << 3) & 0x3f)) ^ bVar10;
      }
      auVar36 = (auVar65 | _DAT_01db3e70) ^ _DAT_01d84390;
      iVar42 = -(uint)(iVar66 < auVar36._0_4_);
      iVar54 = -(uint)(iVar67 < auVar36._4_4_);
      iVar53 = -(uint)(iVar40 < auVar36._8_4_);
      iVar55 = -(uint)(iVar41 < auVar36._12_4_);
      auVar46._4_4_ = iVar42;
      auVar46._0_4_ = iVar42;
      auVar46._8_4_ = iVar53;
      auVar46._12_4_ = iVar53;
      iVar42 = -(uint)(auVar36._4_4_ == iVar67);
      iVar53 = -(uint)(auVar36._12_4_ == iVar41);
      auVar63._4_4_ = iVar42;
      auVar63._0_4_ = iVar42;
      auVar63._8_4_ = iVar53;
      auVar63._12_4_ = iVar53;
      auVar72._4_4_ = iVar54;
      auVar72._0_4_ = iVar54;
      auVar72._8_4_ = iVar55;
      auVar72._12_4_ = iVar55;
      auVar36 = auVar63 & auVar46 | auVar72;
      auVar36 = packssdw(auVar36,auVar36);
      auVar3._8_4_ = 0xffffffff;
      auVar3._0_8_ = 0xffffffffffffffff;
      auVar3._12_4_ = 0xffffffff;
      auVar36 = packssdw(auVar36 ^ auVar3,auVar36 ^ auVar3);
      auVar36 = packsswb(auVar36,auVar36);
      if ((auVar36 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        blob_00[uVar13 + 9] = (byte)(uVar9 >> (((char)lVar32 + -1) * '\b' & 0x3fU)) ^ bVar10;
      }
      auVar36 = pshufhw(auVar36,auVar46,0x84);
      auVar43 = pshufhw(auVar46,auVar63,0x84);
      auVar38 = pshufhw(auVar36,auVar72,0x84);
      auVar20._8_4_ = 0xffffffff;
      auVar20._0_8_ = 0xffffffffffffffff;
      auVar20._12_4_ = 0xffffffff;
      auVar20 = (auVar38 | auVar43 & auVar36) ^ auVar20;
      auVar36 = packssdw(auVar20,auVar20);
      auVar36 = packsswb(auVar36,auVar36);
      if ((auVar36._6_2_ >> 8 & 1) != 0) {
        blob_00[uVar13 + 10] = (byte)(uVar9 >> ((byte)((int)(lVar33 + -1) << 3) & 0x3f)) ^ bVar10;
      }
      auVar36 = (auVar65 | _DAT_01dd4080) ^ _DAT_01d84390;
      auVar58._0_4_ = -(uint)(iVar66 < auVar36._0_4_);
      auVar58._4_4_ = -(uint)(iVar67 < auVar36._4_4_);
      auVar58._8_4_ = -(uint)(iVar40 < auVar36._8_4_);
      auVar58._12_4_ = -(uint)(iVar41 < auVar36._12_4_);
      auVar73._4_4_ = auVar58._0_4_;
      auVar73._0_4_ = auVar58._0_4_;
      auVar73._8_4_ = auVar58._8_4_;
      auVar73._12_4_ = auVar58._8_4_;
      auVar43 = pshuflw(auVar63,auVar73,0xe8);
      auVar21._0_4_ = -(uint)(auVar36._0_4_ == iVar66);
      auVar21._4_4_ = -(uint)(auVar36._4_4_ == iVar67);
      auVar21._8_4_ = -(uint)(auVar36._8_4_ == iVar40);
      auVar21._12_4_ = -(uint)(auVar36._12_4_ == iVar41);
      auVar47._4_4_ = auVar21._4_4_;
      auVar47._0_4_ = auVar21._4_4_;
      auVar47._8_4_ = auVar21._12_4_;
      auVar47._12_4_ = auVar21._12_4_;
      auVar36 = pshuflw(auVar21,auVar47,0xe8);
      auVar48._4_4_ = auVar58._4_4_;
      auVar48._0_4_ = auVar58._4_4_;
      auVar48._8_4_ = auVar58._12_4_;
      auVar48._12_4_ = auVar58._12_4_;
      auVar38 = pshuflw(auVar58,auVar48,0xe8);
      auVar59._8_4_ = 0xffffffff;
      auVar59._0_8_ = 0xffffffffffffffff;
      auVar59._12_4_ = 0xffffffff;
      auVar59 = (auVar38 | auVar36 & auVar43) ^ auVar59;
      auVar38 = packssdw(auVar59,auVar59);
      auVar36 = packsswb(auVar36 & auVar43,auVar38);
      if ((auVar36 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        blob_00[uVar13 + 0xb] = (byte)(uVar9 >> (((char)lVar30 + -1) * '\b' & 0x3fU)) ^ bVar10;
      }
      auVar48 = auVar47 & auVar73 | auVar48;
      auVar38 = packssdw(auVar48,auVar48);
      auVar4._8_4_ = 0xffffffff;
      auVar4._0_8_ = 0xffffffffffffffff;
      auVar4._12_4_ = 0xffffffff;
      auVar38 = packssdw(auVar38 ^ auVar4,auVar38 ^ auVar4);
      auVar36 = packsswb(auVar36,auVar38);
      if ((auVar36._8_2_ >> 8 & 1) != 0) {
        blob_00[uVar13 + 0xc] = (byte)(uVar9 >> ((byte)((int)(lVar31 + -1) << 3) & 0x3f)) ^ bVar10;
      }
      auVar36 = (auVar65 | _DAT_01dd4070) ^ _DAT_01d84390;
      iVar42 = -(uint)(iVar66 < auVar36._0_4_);
      iVar54 = -(uint)(iVar67 < auVar36._4_4_);
      iVar53 = -(uint)(iVar40 < auVar36._8_4_);
      iVar55 = -(uint)(iVar41 < auVar36._12_4_);
      auVar49._4_4_ = iVar42;
      auVar49._0_4_ = iVar42;
      auVar49._8_4_ = iVar53;
      auVar49._12_4_ = iVar53;
      iVar42 = -(uint)(auVar36._4_4_ == iVar67);
      iVar53 = -(uint)(auVar36._12_4_ == iVar41);
      auVar64._4_4_ = iVar42;
      auVar64._0_4_ = iVar42;
      auVar64._8_4_ = iVar53;
      auVar64._12_4_ = iVar53;
      auVar74._4_4_ = iVar54;
      auVar74._0_4_ = iVar54;
      auVar74._8_4_ = iVar55;
      auVar74._12_4_ = iVar55;
      auVar36 = auVar64 & auVar49 | auVar74;
      auVar36 = packssdw(auVar36,auVar36);
      auVar5._8_4_ = 0xffffffff;
      auVar5._0_8_ = 0xffffffffffffffff;
      auVar5._12_4_ = 0xffffffff;
      auVar36 = packssdw(auVar36 ^ auVar5,auVar36 ^ auVar5);
      auVar36 = packsswb(auVar36,auVar36);
      if ((auVar36 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        blob_00[uVar13 + 0xd] = (byte)(uVar9 >> (((char)lVar28 + -1) * '\b' & 0x3fU)) ^ bVar10;
      }
      auVar36 = pshufhw(auVar36,auVar49,0x84);
      auVar43 = pshufhw(auVar49,auVar64,0x84);
      auVar38 = pshufhw(auVar36,auVar74,0x84);
      auVar22._8_4_ = 0xffffffff;
      auVar22._0_8_ = 0xffffffffffffffff;
      auVar22._12_4_ = 0xffffffff;
      auVar22 = (auVar38 | auVar43 & auVar36) ^ auVar22;
      auVar36 = packssdw(auVar22,auVar22);
      auVar36 = packsswb(auVar36,auVar36);
      if ((auVar36._10_2_ >> 8 & 1) != 0) {
        blob_00[uVar13 + 0xe] = (byte)(uVar9 >> ((byte)((int)(lVar29 + -1) << 3) & 0x3f)) ^ bVar10;
      }
      auVar36 = (auVar65 | _DAT_01dd4060) ^ _DAT_01d84390;
      auVar60._0_4_ = -(uint)(iVar66 < auVar36._0_4_);
      auVar60._4_4_ = -(uint)(iVar67 < auVar36._4_4_);
      auVar60._8_4_ = -(uint)(iVar40 < auVar36._8_4_);
      auVar60._12_4_ = -(uint)(iVar41 < auVar36._12_4_);
      auVar75._4_4_ = auVar60._0_4_;
      auVar75._0_4_ = auVar60._0_4_;
      auVar75._8_4_ = auVar60._8_4_;
      auVar75._12_4_ = auVar60._8_4_;
      auVar43 = pshuflw(auVar64,auVar75,0xe8);
      auVar23._0_4_ = -(uint)(auVar36._0_4_ == iVar66);
      auVar23._4_4_ = -(uint)(auVar36._4_4_ == iVar67);
      auVar23._8_4_ = -(uint)(auVar36._8_4_ == iVar40);
      auVar23._12_4_ = -(uint)(auVar36._12_4_ == iVar41);
      auVar50._4_4_ = auVar23._4_4_;
      auVar50._0_4_ = auVar23._4_4_;
      auVar50._8_4_ = auVar23._12_4_;
      auVar50._12_4_ = auVar23._12_4_;
      auVar36 = pshuflw(auVar23,auVar50,0xe8);
      auVar51._4_4_ = auVar60._4_4_;
      auVar51._0_4_ = auVar60._4_4_;
      auVar51._8_4_ = auVar60._12_4_;
      auVar51._12_4_ = auVar60._12_4_;
      auVar38 = pshuflw(auVar60,auVar51,0xe8);
      auVar6._8_4_ = 0xffffffff;
      auVar6._0_8_ = 0xffffffffffffffff;
      auVar6._12_4_ = 0xffffffff;
      auVar36 = packssdw(auVar36 & auVar43,(auVar38 | auVar36 & auVar43) ^ auVar6);
      auVar36 = packsswb(auVar36,auVar36);
      if ((auVar36 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        blob_00[uVar13 + 0xf] = (byte)(uVar9 >> (((char)lVar26 + -1) * '\b' & 0x3fU)) ^ bVar10;
      }
      auVar51 = auVar50 & auVar75 | auVar51;
      auVar38 = packssdw(auVar51,auVar51);
      auVar7._8_4_ = 0xffffffff;
      auVar7._0_8_ = 0xffffffffffffffff;
      auVar7._12_4_ = 0xffffffff;
      auVar36 = packssdw(auVar36,auVar38 ^ auVar7);
      auVar36 = packsswb(auVar36,auVar36);
      if ((auVar36._12_2_ >> 8 & 1) != 0) {
        blob_00[uVar13 + 0x10] = (byte)(uVar9 >> ((byte)((int)(lVar27 + -1) << 3) & 0x3f)) ^ bVar10;
      }
      lVar76 = lStack_50;
      lVar68 = lStack_50 + -1;
      auVar36 = (auVar65 | _DAT_01dd4050) ^ _DAT_01d84390;
      auVar24._0_4_ = -(uint)(iVar66 < auVar36._0_4_);
      auVar24._4_4_ = -(uint)(iVar67 < auVar36._4_4_);
      auVar24._8_4_ = -(uint)(iVar40 < auVar36._8_4_);
      auVar24._12_4_ = -(uint)(iVar41 < auVar36._12_4_);
      auVar52._4_4_ = auVar24._0_4_;
      auVar52._0_4_ = auVar24._0_4_;
      auVar52._8_4_ = auVar24._8_4_;
      auVar52._12_4_ = auVar24._8_4_;
      iVar66 = -(uint)(auVar36._4_4_ == iVar67);
      iVar67 = -(uint)(auVar36._12_4_ == iVar41);
      auVar39._4_4_ = iVar66;
      auVar39._0_4_ = iVar66;
      auVar39._8_4_ = iVar67;
      auVar39._12_4_ = iVar67;
      in_XMM12._4_4_ = auVar24._4_4_;
      in_XMM12._0_4_ = auVar24._4_4_;
      in_XMM12._8_4_ = auVar24._12_4_;
      in_XMM12._12_4_ = auVar24._12_4_;
      in_XMM10 = auVar39 & auVar52 | in_XMM12;
      auVar36 = packssdw(auVar24,in_XMM10);
      auVar8._8_4_ = 0xffffffff;
      auVar8._0_8_ = 0xffffffffffffffff;
      auVar8._12_4_ = 0xffffffff;
      auVar36 = packssdw(auVar36 ^ auVar8,auVar36 ^ auVar8);
      auVar36 = packsswb(auVar36,auVar36);
      if ((auVar36 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        blob_00[uVar13 + 0x11] = (byte)(uVar9 >> (((char)local_58 + -1) * '\b' & 0x3fU)) ^ bVar10;
      }
      auVar36 = pshufhw(auVar36,auVar52,0x84);
      auVar43 = pshufhw(auVar39,auVar39,0x84);
      auVar38 = pshufhw(auVar36,in_XMM12,0x84);
      auVar25._8_4_ = 0xffffffff;
      auVar25._0_8_ = 0xffffffffffffffff;
      auVar25._12_4_ = 0xffffffff;
      auVar25 = (auVar38 | auVar43 & auVar36) ^ auVar25;
      auVar36 = packssdw(auVar25,auVar25);
      auVar36 = packsswb(auVar36,auVar36);
      if ((auVar36._14_2_ >> 8 & 1) != 0) {
        blob_00[uVar13 + 0x12] = (byte)(uVar9 >> ((byte)((int)lVar68 << 3) & 0x3f)) ^ bVar10;
      }
      uVar13 = uVar13 + 0x10;
      uVar16 = uVar16 - 0x10;
      lVar17 = lVar17 + -0x10;
      lVar77 = lVar77 + -0x10;
      lVar78 = lVar78 + -0x10;
      lVar34 = lVar34 + -0x10;
      lVar35 = lVar35 + -0x10;
      lVar32 = lVar32 + -0x10;
      lVar33 = lVar33 + -0x10;
      lVar30 = lVar30 + -0x10;
      lVar31 = lVar31 + -0x10;
      lVar28 = lVar28 + -0x10;
      lVar29 = lVar29 + -0x10;
      lVar26 = lVar26 + -0x10;
      lVar27 = lVar27 + -0x10;
      lVar68 = local_58 + -0x10;
      lVar76 = lVar76 + -0x10;
    } while (((ulong)&(vector->type).field_0x4 & 0xfffffffffffffff0) != uVar13);
  }
  uVar9 = (ulong)(uint)local_68._0_4_;
  if (uVar9 < 0xd) {
    switchD_01043a80::default(local_68 + uVar9 + 4,0,0xc - uVar9);
  }
  else {
    local_68._4_4_ = *(undefined4 *)local_68._8_8_;
  }
  sVar79.value.pointer.ptr = (char *)local_68._8_8_;
  sVar79.value._0_8_ = local_68._0_8_;
  return (string_t)sVar79.value;
}

Assistant:

string_t IntToVarInt(Vector &result, T int_value) {
	// Determine if the number is negative
	bool is_negative = int_value < 0;
	// Determine the number of data bytes
	uint64_t abs_value;
	if (is_negative) {
		if (int_value == std::numeric_limits<T>::min()) {
			abs_value = static_cast<uint64_t>(std::numeric_limits<T>::max()) + 1;
		} else {
			abs_value = static_cast<uint64_t>(std::abs(static_cast<int64_t>(int_value)));
		}
	} else {
		abs_value = static_cast<uint64_t>(int_value);
	}
	uint32_t data_byte_size;
	if (abs_value != NumericLimits<uint64_t>::Maximum()) {
		data_byte_size = (abs_value == 0) ? 1 : static_cast<uint32_t>(std::ceil(std::log2(abs_value + 1) / 8.0));
	} else {
		data_byte_size = static_cast<uint32_t>(std::ceil(std::log2(abs_value) / 8.0));
	}

	uint32_t blob_size = data_byte_size + Varint::VARINT_HEADER_SIZE;
	auto blob = StringVector::EmptyString(result, blob_size);
	auto writable_blob = blob.GetDataWriteable();
	Varint::SetHeader(writable_blob, data_byte_size, is_negative);

	// Add data bytes to the blob, starting off after header bytes
	idx_t wb_idx = Varint::VARINT_HEADER_SIZE;
	for (int i = static_cast<int>(data_byte_size) - 1; i >= 0; --i) {
		if (is_negative) {
			writable_blob[wb_idx++] = static_cast<char>(~(abs_value >> i * 8 & 0xFF));
		} else {
			writable_blob[wb_idx++] = static_cast<char>(abs_value >> i * 8 & 0xFF);
		}
	}
	blob.Finalize();
	return blob;
}